

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_defun.hpp
# Opt level: O0

undefined8 squall::detail::TypeMaskList<Foo*>::doit_abi_cxx11_(void)

{
  SQChar SVar1;
  undefined8 in_RDI;
  string local_30 [40];
  
  SVar1 = typemask<Foo*>();
  TypeMaskList<>::doit_abi_cxx11_();
  std::operator+((char)in_RDI,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (ulong)(uint)(int)SVar1);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

static string doit() {
        return typemask<H>() + TypeMaskList<T...>::doit();
    }